

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O2

PDFObject * __thiscall PDFObjectParser::ParseLiteralString(PDFObjectParser *this,string *inToken)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  PDFObjectParser *this_00;
  char *pcVar4;
  Trace *this_01;
  PDFLiteralString *this_02;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char local_e1;
  PDFObjectParser *local_e0;
  string local_d8;
  string local_b8;
  stringbuf stringBuffer;
  
  std::__cxx11::stringbuf::stringbuf((stringbuf *)&stringBuffer);
  pcVar7 = (inToken->_M_dataplus)._M_p;
  pcVar4 = (char *)std::__cxx11::string::at((ulong)inToken);
  if (*pcVar4 == ')') {
    uVar6 = 1;
    local_e0 = this;
    while (uVar3 = inToken->_M_string_length, uVar6 < uVar3 - 1) {
      local_e1 = pcVar7[1];
      uVar5 = uVar6;
      pcVar4 = pcVar7 + 1;
      if (local_e1 == '\\') {
        pcVar4 = pcVar7 + 2;
        uVar5 = uVar6 + 1;
        bVar2 = pcVar7[2];
        if ((bVar2 & 0xf8) == 0x30) {
          local_e1 = bVar2 - 0x30;
          uVar1 = uVar6 + 2;
          if ((uVar1 < uVar3) && ((pcVar7[3] & 0xf8U) == 0x30)) {
            local_e1 = pcVar7[3] + local_e1 * '\b' + -0x30;
            uVar5 = uVar1;
            pcVar4 = pcVar7 + 3;
            if ((uVar6 + 3 < uVar3) && ((pcVar7[4] & 0xf8U) == 0x30)) {
              local_e1 = pcVar7[4] + local_e1 * '\b' + -0x30;
              uVar5 = uVar6 + 3;
              pcVar4 = pcVar7 + 4;
            }
          }
        }
        else if (bVar2 == 0x28) {
          local_e1 = '(';
        }
        else if (bVar2 == 0x29) {
          local_e1 = ')';
        }
        else if (bVar2 == 0x5c) {
          local_e1 = '\\';
        }
        else if (bVar2 == 0x62) {
          local_e1 = '\b';
        }
        else if (bVar2 == 0x66) {
          local_e1 = '\f';
        }
        else if (bVar2 == 0x74) {
          local_e1 = '\t';
        }
        else if (bVar2 == 0x72) {
          local_e1 = '\r';
        }
        else if (bVar2 == 0x6e) {
          local_e1 = '\n';
        }
        else {
          local_e1 = '\0';
        }
      }
      pcVar7 = pcVar4;
      (**(code **)(_stringBuffer + 0x60))(&stringBuffer,&local_e1,1);
      uVar6 = uVar5 + 1;
    }
    this_02 = (PDFLiteralString *)operator_new(0x68);
    this_00 = local_e0;
    std::__cxx11::stringbuf::str();
    MaybeDecryptString(&local_d8,this_00,&local_b8);
    PDFLiteralString::PDFLiteralString(this_02,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    this_01 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)inToken);
    Trace::TraceToLog(this_01,
                      "PDFObjectParser::ParseLiteralString, exception in parsing literal string, no closing paranthesis, Expression: %s"
                      ,local_d8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = (PDFLiteralString *)0x0;
  }
  std::__cxx11::stringbuf::~stringbuf((stringbuf *)&stringBuffer);
  return &this_02->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseLiteralString(const std::string& inToken)
{
  std::stringbuf stringBuffer;
	Byte buffer;
	std::string::const_iterator it = inToken.begin();
	size_t i=1;
	++it; // skip first paranthesis
	
	// verify that last character is ')'
	if(inToken.at(inToken.size()-1) != scRightParanthesis)
	{
		TRACE_LOG1("PDFObjectParser::ParseLiteralString, exception in parsing literal string, no closing paranthesis, Expression: %s",inToken.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}

	for(; i < inToken.size()-1;++it,++i)
	{
		if(*it == '\\')
		{
			++it;
			++i;
			if('0' <= *it && *it <= '7')
			{
				buffer = (*it - '0');
				if (i+1 < inToken.size() && '0' <= *(it+1) && *(it+1) <= '7'){
					++it;
					++i;
					buffer = buffer << 3;
					buffer += (*it - '0');
					if (i + 1 < inToken.size() && '0' <= *(it + 1) && *(it + 1) <= '7'){
						++it;
						++i;
						buffer = buffer << 3;
						buffer += (*it - '0');
					}
				}
			}
			else
			{
				switch(*it)
				{
					case 'n':
						buffer = '\n';
						break;
					case 'r':
						buffer = '\r';
						break;
					case 't':
						buffer = '\t';
						break;
					case 'b':
						buffer = '\b';
						break;
					case 'f':
						buffer = '\f';
						break;
					case '\\':
						buffer = '\\';
						break;
					case '(':
						buffer = '(';
						break;
					case ')':
						buffer = ')';
						break;
					default:
						// error!
						buffer = 0;
						break;
				}
			}
		}
		else
		{
			buffer = *it;
		}
		stringBuffer.sputn((const char*)&buffer,1);
	}

	return new PDFLiteralString(MaybeDecryptString(stringBuffer.str()));
}